

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O1

int main(void)

{
  double dVar1;
  array<vec<4UL,_double>,_3UL> pts;
  vec3f eye;
  vec3f center;
  vec3f up;
  size_t sVar2;
  long lVar3;
  size_t __n;
  void *extraout_RDX;
  void *extraout_RDX_00;
  void *__buf;
  vec<4UL,_double> *pvVar4;
  int j;
  mat4 *pmVar5;
  mat4 *pmVar6;
  double *pdVar7;
  size_t i;
  ulong uVar8;
  byte bVar9;
  DepthBuffer zbuffer;
  TGAImage image;
  array<vec<4UL,_double>,_3UL> screen_coords;
  Model model;
  GouraudShader shader;
  double dVar10;
  double dVar11;
  double dVar12;
  double dVar13;
  double dVar14;
  double dVar15;
  double dVar16;
  double dVar17;
  double dVar18;
  undefined1 in_stack_fffffffffffffb80 [24];
  string local_468;
  string local_448;
  size_t in_stack_fffffffffffffbe0;
  pointer in_stack_fffffffffffffbe8;
  pointer in_stack_fffffffffffffbf0;
  pointer in_stack_fffffffffffffbf8;
  pointer in_stack_fffffffffffffc00;
  pointer in_stack_fffffffffffffc08;
  pointer in_stack_fffffffffffffc10;
  undefined1 in_stack_fffffffffffffc18 [16];
  vec4f local_3d8;
  mat4 local_3b8;
  Model local_338;
  GouraudShader local_230;
  
  bVar9 = 0;
  local_448._M_dataplus._M_p = (pointer)&local_448.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_448,"obj/african_head.obj","");
  Model::Model(&local_338,&local_448,true,false,false);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_448._M_dataplus._M_p != &local_448.field_2) {
    operator_delete(local_448._M_dataplus._M_p,local_448.field_2._M_allocated_capacity + 1);
  }
  vec<3UL,_double>::normalize(&light_dir);
  TGAImage::TGAImage((TGAImage *)&stack0xfffffffffffffc00,800,800,3);
  DepthBuffer::DepthBuffer((DepthBuffer *)&stack0xfffffffffffffbd8,800,800);
  pmVar6 = &local_230.super_IShader.uniform_ModelView;
  memset(pmVar6,0,0x180);
  local_230.super_IShader._vptr_IShader = (_func_int **)&PTR__IShader_00109d30;
  local_230.varying_tri.rows[0].x = 0.0;
  local_230.varying_tri.rows[0].y = 0.0;
  local_230.varying_tri.rows[0].z = 0.0;
  local_230.varying_tri.rows[1].x = 0.0;
  local_230.varying_tri.rows[1].y = 0.0;
  local_230.varying_tri.rows[1].z = 0.0;
  local_230.varying_tri.rows[2].x = 0.0;
  local_230.varying_tri.rows[2].y = 0.0;
  local_230.varying_tri.rows[2].z = 0.0;
  local_230.varying_ity.x = 0.0;
  local_230.varying_ity.y = 0.0;
  local_230.varying_ity.z = 0.0;
  local_230.uniform_light_dir.x = 0.0;
  local_230.uniform_light_dir.y = 0.0;
  local_230.uniform_light_dir.z = 0.0;
  eye.y = (double)in_stack_fffffffffffffbe8;
  eye.x = (double)in_stack_fffffffffffffbe0;
  eye.z = (double)in_stack_fffffffffffffbf0;
  center.y = (double)in_stack_fffffffffffffc00;
  center.x = (double)in_stack_fffffffffffffbf8;
  center.z = (double)in_stack_fffffffffffffc08;
  up.y = (double)in_stack_fffffffffffffc18._0_8_;
  up.z = (double)in_stack_fffffffffffffc18._8_8_;
  up.x = (double)in_stack_fffffffffffffc10;
  dVar10 = ::eye.x;
  dVar11 = ::eye.y;
  dVar12 = ::eye.z;
  dVar13 = ::center.x;
  dVar14 = ::center.y;
  dVar15 = ::center.z;
  dVar16 = ::up.x;
  dVar17 = ::up.y;
  dVar18 = ::up.z;
  lookat(eye,center,up);
  pmVar5 = &local_3b8;
  for (lVar3 = 0x10; lVar3 != 0; lVar3 = lVar3 + -1) {
    pmVar6->rows[0].data[0] = pmVar5->rows[0].data[0];
    pmVar5 = (mat4 *)((long)pmVar5 + ((ulong)bVar9 * -2 + 1) * 8);
    pmVar6 = (mat4 *)((long)pmVar6 + ((ulong)bVar9 * -2 + 1) * 8);
  }
  viewport(&local_3b8,100,100,600,600);
  pmVar6 = &local_3b8;
  pmVar5 = &local_230.super_IShader.uniform_Viewport;
  for (lVar3 = 0x10; lVar3 != 0; lVar3 = lVar3 + -1) {
    pmVar5->rows[0].data[0] = pmVar6->rows[0].data[0];
    pmVar6 = (mat4 *)((long)pmVar6 + ((ulong)bVar9 * -2 + 1) * 8);
    pmVar5 = (mat4 *)((long)pmVar5 + ((ulong)bVar9 * -2 + 1) * 8);
  }
  operator-((vec<3UL,_double> *)&local_3d8,&::eye,&::center);
  dVar1 = dot<3ul,double>((vec<3UL,_double> *)&local_3d8,(vec<3UL,_double> *)&local_3d8);
  if (dVar1 < 0.0) {
    dVar1 = sqrt(dVar1);
  }
  else {
    dVar1 = SQRT(dVar1);
  }
  projection(-1.0 / dVar1);
  pmVar6 = &local_3b8;
  pmVar5 = &local_230.super_IShader.uniform_Projection;
  for (lVar3 = 0x10; lVar3 != 0; lVar3 = lVar3 + -1) {
    pmVar5->rows[0].data[0] = pmVar6->rows[0].data[0];
    pmVar6 = (mat4 *)((long)pmVar6 + ((ulong)bVar9 * -2 + 1) * 8);
    pmVar5 = (mat4 *)((long)pmVar5 + ((ulong)bVar9 * -2 + 1) * 8);
  }
  local_230.uniform_light_dir.x = light_dir.x;
  local_230.uniform_light_dir.y = light_dir.y;
  local_230.uniform_light_dir.z = light_dir.z;
  uVar8 = 0;
  while( true ) {
    pvVar4 = local_3b8.rows;
    sVar2 = Model::nfaces(&local_338);
    if (sVar2 <= uVar8) break;
    local_3b8.rows[2].data[2] = 0.0;
    local_3b8.rows[2].data[3] = 0.0;
    local_3b8.rows[2].data[0] = 0.0;
    local_3b8.rows[2].data[1] = 0.0;
    local_3b8.rows[1].data[2] = 0.0;
    local_3b8.rows[1].data[3] = 0.0;
    local_3b8.rows[1].data[0] = 0.0;
    local_3b8.rows[1].data[1] = 0.0;
    local_3b8.rows[0].data[2] = 0.0;
    local_3b8.rows[0].data[3] = 0.0;
    local_3b8.rows[0].data[0] = 0.0;
    local_3b8.rows[0].data[1] = 0.0;
    lVar3 = 0;
    do {
      GouraudShader::vertex(&local_3d8,&local_230,&local_338,(int)uVar8,(int)lVar3);
      ((vec<4UL,_double> *)pvVar4->data)->data[2] = local_3d8.data[2];
      ((vec<4UL,_double> *)pvVar4->data)->data[3] = local_3d8.data[3];
      ((vec<4UL,_double> *)pvVar4->data)->data[0] = local_3d8.data[0];
      ((vec<4UL,_double> *)pvVar4->data)->data[1] = local_3d8.data[1];
      lVar3 = lVar3 + 1;
      pvVar4 = pvVar4 + 1;
    } while (lVar3 != 3);
    pmVar6 = &local_3b8;
    pdVar7 = (double *)&stack0xfffffffffffffb38;
    for (lVar3 = 0xc; lVar3 != 0; lVar3 = lVar3 + -1) {
      *pdVar7 = pmVar6->rows[0].data[0];
      pmVar6 = (mat4 *)((long)pmVar6 + ((ulong)bVar9 * -2 + 1) * 8);
      pdVar7 = pdVar7 + (ulong)bVar9 * -2 + 1;
    }
    pts._M_elems[0].data[1] = dVar11;
    pts._M_elems[0].data[0] = dVar10;
    pts._M_elems[0].data[2] = dVar12;
    pts._M_elems[0].data[3] = dVar13;
    pts._M_elems[1].data[0] = dVar14;
    pts._M_elems[1].data[1] = dVar15;
    pts._M_elems[1].data[2] = dVar16;
    pts._M_elems[1].data[3] = dVar17;
    pts._M_elems[2].data[0] = dVar18;
    pts._M_elems[2].data[1] = (double)in_stack_fffffffffffffb80._0_8_;
    pts._M_elems[2].data[2] = (double)in_stack_fffffffffffffb80._8_8_;
    pts._M_elems[2].data[3] = (double)in_stack_fffffffffffffb80._16_8_;
    triangle(&local_338,pts,&local_230.super_IShader,(TGAImage *)&stack0xfffffffffffffc00,
             (DepthBuffer *)&stack0xfffffffffffffbd8);
    uVar8 = uVar8 + 1;
  }
  local_468._M_dataplus._M_p = (pointer)&local_468.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_468,"output.tga","");
  __n = 1;
  TGAImage::write_tga_file((TGAImage *)&stack0xfffffffffffffc00,&local_468,true,true);
  __buf = extraout_RDX;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_468._M_dataplus._M_p != &local_468.field_2) {
    operator_delete(local_468._M_dataplus._M_p,local_468.field_2._M_allocated_capacity + 1);
    __buf = extraout_RDX_00;
  }
  DepthBuffer::write((DepthBuffer *)&stack0xfffffffffffffbd8,0x107038,__buf,__n);
  IShader::~IShader(&local_230.super_IShader);
  if (in_stack_fffffffffffffbe8 != (pointer)0x0) {
    operator_delete(in_stack_fffffffffffffbe8,
                    (long)in_stack_fffffffffffffbf8 - (long)in_stack_fffffffffffffbe8);
  }
  if (in_stack_fffffffffffffc00 != (pointer)0x0) {
    operator_delete(in_stack_fffffffffffffc00,
                    (long)in_stack_fffffffffffffc10 - (long)in_stack_fffffffffffffc00);
  }
  Model::~Model(&local_338);
  return 0;
}

Assistant:

int main()
{
    Model model{"obj/african_head.obj", true, false, false};

    light_dir.normalize();

    TGAImage image(width, height, TGAImage::RGB);
    DepthBuffer zbuffer(width, height);

    GouraudShader shader;
    shader.uniform_ModelView = lookat(eye, center, up);
    shader.uniform_Viewport = viewport(width / 8, height / 8, width * 3 / 4, height * 3 / 4);
    shader.uniform_Projection = projection(-1. / (eye - center).norm());
    shader.uniform_light_dir = light_dir;
    for (size_t i = 0; i < model.nfaces(); i++) {
        std::array<vec4f, 3> screen_coords;
        for (int j = 0; j < 3; j++) {
            screen_coords[j] = shader.vertex(model, i, j);
        }
        triangle(model, screen_coords, shader, image, zbuffer);
    }

    // image.flip_vertically();  // to place the origin in the bottom left corner of the image
    // zbuffer.flip_vertically();
    image.write_tga_file("output.tga");
    zbuffer.write("zbuffer.tga");

    return 0;
}